

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

CProgramPtr __thiscall
Refal2::CInternalProgramBuilder::Build
          (CInternalProgramBuilder *this,CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  CProgram *this_00;
  size_type sVar2;
  char *__to;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CProgramPtr CVar3;
  undefined1 local_90 [8];
  CInternalProgramBuilder builder;
  CErrorsHelper *errors_local;
  CModuleDataVector *modules_local;
  CProgramPtr *program;
  
  std::shared_ptr<Refal2::CProgram>::shared_ptr((shared_ptr<Refal2::CProgram> *)this);
  bVar1 = CErrorsHelper::HasErrors(errors);
  if ((!bVar1) &&
     (bVar1 = std::
              vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
              ::empty(modules), !bVar1)) {
    CInternalProgramBuilder((CInternalProgramBuilder *)local_90,errors);
    collect((CInternalProgramBuilder *)local_90,modules);
    bVar1 = CErrorsHelper::HasErrors(errors);
    if (!bVar1) {
      check((CInternalProgramBuilder *)local_90);
      bVar1 = CErrorsHelper::HasErrors(errors);
      if (!bVar1) {
        this_00 = (CProgram *)operator_new(0x48);
        sVar2 = std::
                vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
                ::size(modules);
        CProgram::CProgram(this_00,(int)sVar2);
        std::__shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>::reset<Refal2::CProgram>
                  ((__shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2> *)
                   &builder.globals.keyToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   this_00);
        compile((CInternalProgramBuilder *)local_90,modules);
        bVar1 = CErrorsHelper::HasErrors(errors);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!errors.HasErrors()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                        ,0xe4,
                        "static CProgramPtr Refal2::CInternalProgramBuilder::Build(CModuleDataVector &, CErrorsHelper &)"
                       );
        }
        link((CInternalProgramBuilder *)local_90,(char *)modules,__to);
        bVar1 = CErrorsHelper::HasErrors(errors);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          __assert_fail("!errors.HasErrors()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Program.cpp"
                        ,0xe6,
                        "static CProgramPtr Refal2::CInternalProgramBuilder::Build(CModuleDataVector &, CErrorsHelper &)"
                       );
        }
        std::shared_ptr<Refal2::CProgram>::operator=
                  ((shared_ptr<Refal2::CProgram> *)this,
                   (shared_ptr<Refal2::CProgram> *)
                   &builder.globals.keyToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
    ~CInternalProgramBuilder((CInternalProgramBuilder *)local_90);
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::clear(modules);
  CVar3.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CProgramPtr)CVar3.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CProgramPtr CInternalProgramBuilder::Build( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	CProgramPtr program;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			if( !errors.HasErrors() ) {
				builder.program.reset( new CProgram( modules.size() ) );
				builder.compile( modules );
				assert( !errors.HasErrors() );
				builder.link( modules );
				assert( !errors.HasErrors() );
				program = builder.program;
			}
		}
	}
	modules.clear();
	return program;
}